

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

Constraint *
slang::ast::ConditionalConstraint::fromSyntax
          (ConditionalConstraintSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ConstraintExprVisitor *visitor_00;
  undefined4 extraout_var;
  ConstraintItemSyntax *pCVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ConditionalConstraint *pCVar5;
  socklen_t __len;
  socklen_t __len_00;
  Compilation *in_RSI;
  long in_RDI;
  ConstraintExprVisitor visitor;
  ConditionalConstraint *result;
  Constraint *elseBody;
  Constraint *ifBody;
  Expression *pred;
  Compilation *comp;
  Compilation *compilation;
  ASTContext *in_stack_ffffffffffffffa8;
  BumpAllocator *in_stack_ffffffffffffffb0;
  Constraint *local_40;
  bitmask<slang::ast::ASTFlags> local_30;
  undefined8 local_28;
  Compilation *local_20;
  Compilation *local_18;
  long local_10;
  ConditionalConstraint *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x6d1ef8);
  visitor_00 = (ConstraintExprVisitor *)
               not_null<slang::syntax::ExpressionSyntax_*>::operator*
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6d1f0b);
  compilation = local_18;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,None);
  iVar2 = Expression::bind((int)visitor_00,(sockaddr *)compilation,(socklen_t)local_30.m_bits);
  local_28 = CONCAT44(extraout_var,iVar2);
  pCVar4 = not_null<slang::syntax::ConstraintItemSyntax_*>::operator*
                     ((not_null<slang::syntax::ConstraintItemSyntax_*> *)0x6d1f4d);
  iVar2 = Constraint::bind((int)pCVar4,(sockaddr *)local_18,__len);
  local_40 = (Constraint *)0x0;
  if (*(long *)(local_10 + 0x58) != 0) {
    pCVar4 = not_null<slang::syntax::ConstraintItemSyntax_*>::operator*
                       ((not_null<slang::syntax::ConstraintItemSyntax_*> *)0x6d1f86);
    iVar3 = Constraint::bind((int)pCVar4,(sockaddr *)local_18,__len_00);
    local_40 = (Constraint *)CONCAT44(extraout_var_01,iVar3);
  }
  pCVar5 = BumpAllocator::
           emplace<slang::ast::ConditionalConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&,slang::ast::Constraint_const*&>
                     (in_stack_ffffffffffffffb0,(Expression *)in_stack_ffffffffffffffa8,
                      (Constraint *)compilation,(Constraint **)visitor_00);
  bVar1 = Expression::bad((Expression *)compilation);
  if (((bVar1) || (bVar1 = Constraint::bad((Constraint *)CONCAT44(extraout_var_00,iVar2)), bVar1))
     || ((local_40 != (Constraint *)0x0 && (bVar1 = Constraint::bad(local_40), bVar1)))) {
    local_8 = (ConditionalConstraint *)
              Constraint::badConstraint(compilation,(Constraint *)visitor_00);
  }
  else {
    ConstraintExprVisitor::ConstraintExprVisitor
              ((ConstraintExprVisitor *)&stack0xffffffffffffffa8,(ASTContext *)local_18,false);
    bVar1 = Expression::visit<slang::ast::ConstraintExprVisitor&>
                      ((Expression *)compilation,visitor_00);
    if ((!bVar1) ||
       (bVar1 = ASTContext::requireBooleanConvertible((ASTContext *)elseBody,(Expression *)result),
       local_8 = pCVar5, !bVar1)) {
      local_8 = (ConditionalConstraint *)
                Constraint::badConstraint(compilation,(Constraint *)visitor_00);
    }
  }
  return &local_8->super_Constraint;
}

Assistant:

Constraint& ConditionalConstraint::fromSyntax(const ConditionalConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& pred = Expression::bind(*syntax.condition, context);
    auto& ifBody = Constraint::bind(*syntax.constraints, context);

    const Constraint* elseBody = nullptr;
    if (syntax.elseClause)
        elseBody = &Constraint::bind(*syntax.elseClause->constraints, context);

    auto result = comp.emplace<ConditionalConstraint>(pred, ifBody, elseBody);
    if (pred.bad() || ifBody.bad() || (elseBody && elseBody->bad()))
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, /* isSoft */ false);
    if (!pred.visit(visitor) || !context.requireBooleanConvertible(pred))
        return badConstraint(comp, result);

    return *result;
}